

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakSet.cpp
# Opt level: O3

void __thiscall
Js::JavascriptWeakSet::ExtractSnapObjectDataInto
          (JavascriptWeakSet *this,SnapObject *objData,SlabAllocator *alloc)

{
  int iVar1;
  Type pRVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint *puVar6;
  void **ppvVar7;
  undefined4 *puVar8;
  ulong uVar9;
  uint uVar10;
  ulong count;
  int i;
  int last;
  
  puVar6 = (uint *)TTD::SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  (**(this->keySet).
     super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
     .super_IWeakReferenceDictionary._vptr_IWeakReferenceDictionary)();
  uVar5 = (this->keySet).
          super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
          .count - (this->keySet).
                   super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                   .freeCount;
  *puVar6 = 0;
  count = (ulong)(uVar5 + 1);
  ppvVar7 = TTD::SlabAllocatorBase<0>::SlabReserveArraySpace<void*>(alloc,count);
  *(void ***)(puVar6 + 2) = ppvVar7;
  uVar10 = (this->keySet).
           super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
           .bucketCount;
  if (uVar10 != 0) {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar9 = 0;
    do {
      i = (this->keySet).
          super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
          .buckets.ptr[uVar9];
      if (i != -1) {
        last = -1;
        do {
          pRVar2 = (this->keySet).
                   super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                   .weakRefs.ptr[i].ptr;
          if (pRVar2 == (Type)0x0) {
            iVar1 = (this->keySet).
                    super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    .entries.ptr[i].super_ValueEntryData<bool>.next;
            JsUtil::
            SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
            ::RemoveAt(&(this->keySet).
                        super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                       ,i,last,(uint)uVar9);
          }
          else {
            uVar10 = *puVar6;
            if (uVar5 <= uVar10) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar8 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptWeakSet.cpp"
                                          ,0xf8,"(ssi->SetSize < setCountEst)","We are writing junk"
                                         );
              if (!bVar4) {
                pcVar3 = (code *)invalidInstructionException();
                (*pcVar3)();
              }
              *puVar8 = 0;
              uVar10 = *puVar6;
            }
            *(Type *)(*(long *)(puVar6 + 2) + (ulong)uVar10 * 8) = pRVar2;
            *puVar6 = uVar10 + 1;
            iVar1 = (this->keySet).
                    super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    .entries.ptr[i].super_ValueEntryData<bool>.next;
            last = i;
          }
          i = iVar1;
        } while (i != -1);
        uVar10 = (this->keySet).
                 super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                 .bucketCount;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < uVar10);
  }
  if ((ulong)*puVar6 == 0) {
    puVar6[2] = 0;
    puVar6[3] = 0;
    TTD::SlabAllocatorBase<0>::SlabAbortArraySpace<void*>(alloc,count);
  }
  else {
    TTD::SlabAllocatorBase<0>::SlabCommitArraySpace<void*>(alloc,(ulong)*puVar6,count);
  }
  if (objData->SnapObjectTag == SnapSetObject) {
    objData->AddtlSnapObjectInfo = puVar6;
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void JavascriptWeakSet::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapSetInfo* ssi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapSetInfo>();
        uint32 setCountEst = this->Size();

        ssi->SetSize = 0;
        ssi->SetValueArray = alloc.SlabReserveArraySpace<TTD::TTDVar>(setCountEst + 1); //always reserve at least 1 element

        this->Map([&](RecyclableObject* key)
        {
            AssertMsg(ssi->SetSize < setCountEst, "We are writing junk");

            ssi->SetValueArray[ssi->SetSize] = key;
            ssi->SetSize++;
        });

        if(ssi->SetSize == 0)
        {
            ssi->SetValueArray = nullptr;
            alloc.SlabAbortArraySpace<TTD::TTDVar>(setCountEst + 1);
        }
        else
        {
            alloc.SlabCommitArraySpace<TTD::TTDVar>(ssi->SetSize, setCountEst + 1);
        }

        TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapSetInfo*, TTD::NSSnapObjects::SnapObjectType::SnapSetObject>(objData, ssi);
    }